

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O3

void __thiscall ezc3d::ParametersNS::Parameters::group(Parameters *this,Group *g)

{
  pointer pGVar1;
  int iVar2;
  Group *this_00;
  string *psVar3;
  Parameter *p;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  if ((this->_groups).
      super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_groups).
      super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar5 = 0xffffffffffffffff;
    sVar6 = 0;
    do {
      this_00 = group(this,sVar6);
      psVar3 = GroupNS::Group::name_abi_cxx11_(this_00);
      GroupNS::Group::name_abi_cxx11_(g);
      iVar2 = std::__cxx11::string::compare((string *)psVar3);
      if (iVar2 == 0) {
        sVar5 = sVar6;
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 < (ulong)(((long)(this->_groups).
                                    super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_groups).
                                    super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x5555555555555555));
    if (sVar5 != 0xffffffffffffffff) {
      sVar6 = GroupNS::Group::nbParameters(g);
      if (sVar6 != 0) {
        sVar6 = 0;
        do {
          pGVar1 = (this->_groups).
                   super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          p = GroupNS::Group::parameter(g,sVar6);
          GroupNS::Group::parameter(pGVar1 + sVar5,p);
          sVar6 = sVar6 + 1;
          sVar4 = GroupNS::Group::nbParameters(g);
        } while (sVar6 < sVar4);
      }
      goto LAB_00130655;
    }
  }
  std::
  vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
  ::push_back(&this->_groups,g);
LAB_00130655:
  psVar3 = GroupNS::Group::name_abi_cxx11_(g);
  setMandatoryParametersForSpecialGroup(this,psVar3);
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::group(
    const ezc3d::ParametersNS::GroupNS::Group &g) {
  // If the group already exist, override and merge
  size_t alreadyExtIdx(SIZE_MAX);
  for (size_t i = 0; i < nbGroups(); ++i)
    if (!group(i).name().compare(g.name()))
      alreadyExtIdx = i;
  if (alreadyExtIdx == SIZE_MAX)
    _groups.push_back(g);
  else {
    for (size_t i = 0; i < g.nbParameters(); ++i)
      _groups[alreadyExtIdx].parameter(g.parameter(i));
  }

  // Do a sanity check for some specific group
  setMandatoryParametersForSpecialGroup(g.name());
}